

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O2

void GC::CheckClass(char *ptr,ExternTypeInfo *type)

{
  ExternMemberInfo *pEVar1;
  ExternTypeInfo *type_00;
  ulong uVar2;
  ExternTypeInfo *realType;
  uint *puVar3;
  
  if ((type->nameHash == objectName) || (type->nameHash == autoArrayName)) {
    if (*(long *)(ptr + 4) != 0) {
      CheckPointer(ptr + 4);
      return;
    }
  }
  else {
    if (type->pointerCount == 0) {
      pEVar1 = (ExternMemberInfo *)0x0;
    }
    else {
      pEVar1 = FastVector<ExternMemberInfo,_false,_false>::operator[]
                         ((FastVector<ExternMemberInfo,_false,_false> *)
                          (NULLC::commonLinker + 0x210),
                          (type->field_8).arrSize + (type->field_11).subType);
    }
    puVar3 = &pEVar1->offset;
    for (uVar2 = 0; uVar2 < type->pointerCount; uVar2 = uVar2 + 1) {
      type_00 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                          ((FastVector<ExternTypeInfo,_false,_false> *)(NULLC::commonLinker + 0x200)
                           ,((ExternMemberInfo *)(puVar3 + -2))->type);
      CheckVariable(ptr + *puVar3,type_00);
      puVar3 = puVar3 + 3;
    }
  }
  return;
}

Assistant:

void CheckClass(char* ptr, const ExternTypeInfo& type)
	{
		if(type.nameHash == objectName)
		{
			NULLCRef *data = (NULLCRef*)ptr;

			// Skip uninitialized array
			if(!data->ptr)
				return;

			CheckPointer((char*)&data->ptr);
		}
		else if(type.nameHash == autoArrayName)
		{
			NULLCAutoArray *data = (NULLCAutoArray*)ptr;

			// Skip uninitialized array
			if(!data->ptr)
				return;

			// Check target data
			CheckPointer((char*)&data->ptr);
		}
		else
		{
			const ExternTypeInfo *realType = &type;

			// Get class member type list
			ExternMemberInfo *memberList = realType->pointerCount ? &NULLC::commonLinker->exTypeExtra[realType->memberOffset + realType->memberCount] : NULL;

			// Check pointer members
			for(unsigned n = 0; n < realType->pointerCount; n++)
			{
				// Get member type
				ExternTypeInfo &subType = NULLC::commonLinker->exTypes[memberList[n].type];
				unsigned pos = memberList[n].offset;

				// Check member
				CheckVariable(ptr + pos, subType);
			}
		}
	}